

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

LightSamplerHandle
pbrt::LightSamplerHandle::Create(string *name,span<const_pbrt::LightHandle> lights,Allocator alloc)

{
  bool bVar1;
  ExhaustiveLightSampler *pEVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar3;
  polymorphic_allocator<std::byte> local_38;
  span<const_pbrt::LightHandle> local_30;
  pointer local_20;
  
  local_30.ptr = (LightHandle *)lights.n;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lights.ptr;
  local_30.n = (size_t)alloc.memoryResource;
  bVar1 = std::operator==(__lhs,"uniform");
  if (bVar1) {
    pEVar2 = (ExhaustiveLightSampler *)
             pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::UniformLightSampler,pstd::span<pbrt::LightHandle_const>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                       (&local_38,&local_30,&local_38);
    uVar3 = 0x1000000000000;
  }
  else {
    bVar1 = std::operator==(__lhs,"power");
    if (bVar1) {
      pEVar2 = (ExhaustiveLightSampler *)
               pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::PowerLightSampler,pstd::span<pbrt::LightHandle_const>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                         (&local_38,&local_30,&local_38);
      uVar3 = 0x2000000000000;
    }
    else {
      bVar1 = std::operator==(__lhs,"bvh");
      if (!bVar1) {
        bVar1 = std::operator==(__lhs,"exhaustive");
        if (bVar1) {
          pEVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::ExhaustiveLightSampler,pstd::span<pbrt::LightHandle_const>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                             (&local_38,&local_30,&local_38);
          uVar3 = 0x4000000000000;
          goto LAB_003b401d;
        }
        local_20 = (__lhs->_M_dataplus)._M_p;
        Error<char_const*>("Light sample distribution type \"%s\" unknown. Using \"bvh\".",&local_20
                          );
      }
      uVar3 = 0x3000000000000;
      pEVar2 = (ExhaustiveLightSampler *)
               pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::BVHLightSampler,pstd::span<pbrt::LightHandle_const>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                         (&local_38,&local_30,&local_38);
    }
  }
LAB_003b401d:
  (name->_M_dataplus)._M_p = (pointer)((ulong)pEVar2 | uVar3);
  return (LightSamplerHandle)
         (TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          )name;
}

Assistant:

LightSamplerHandle LightSamplerHandle::Create(const std::string &name,
                                              pstd::span<const LightHandle> lights,
                                              Allocator alloc) {
    if (name == "uniform")
        return alloc.new_object<UniformLightSampler>(lights, alloc);
    else if (name == "power")
        return alloc.new_object<PowerLightSampler>(lights, alloc);
    else if (name == "bvh")
        return alloc.new_object<BVHLightSampler>(lights, alloc);
    else if (name == "exhaustive")
        return alloc.new_object<ExhaustiveLightSampler>(lights, alloc);
    else {
        Error(R"(Light sample distribution type "%s" unknown. Using "bvh".)",
              name.c_str());
        return alloc.new_object<BVHLightSampler>(lights, alloc);
    }
}